

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,VariableDeclaration *v)

{
  Expression *pEVar1;
  VariableDeclaration *pVVar2;
  Type type;
  Context local_70;
  Type local_58;
  CompileMessage local_40;
  
  ASTVisitor::visit(&this->super_ASTVisitor,v);
  pEVar1 = (v->declaredType).object;
  if (pEVar1 == (Expression *)0x0) {
    pEVar1 = (v->initialValue).object;
    if (pEVar1 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    throwErrorIfNotReadableValue(pEVar1);
  }
  else {
    throwErrorIfNotReadableType(pEVar1);
  }
  AST::VariableDeclaration::getType(&local_58,v);
  pVVar2 = (VariableDeclaration *)(v->declaredType).object;
  if (pVVar2 == (VariableDeclaration *)0x0) {
    pVVar2 = v;
  }
  local_70.location.sourceCode.object =
       (pVVar2->super_Statement).super_ASTObject.context.location.sourceCode.object;
  if (local_70.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_70.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_70.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_70.location.location.data =
       (pVVar2->super_Statement).super_ASTObject.context.location.location.data;
  local_70.parentScope = (pVVar2->super_Statement).super_ASTObject.context.parentScope;
  if (local_58.primitiveType.type != void_) {
    throwErrorIfMultidimensionalArray(&local_70,&local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
    return;
  }
  CompileMessageHelpers::createMessage<>
            (&local_40,syntax,error,"A variable type cannot be \'void\'");
  AST::Context::throwError(&local_70,&local_40,false);
}

Assistant:

void visit (AST::VariableDeclaration& v) override
        {
            super::visit (v);

            if (v.declaredType == nullptr)
                throwErrorIfNotReadableValue (*v.initialValue);
            else
                throwErrorIfNotReadableType (*v.declaredType);

            auto type = v.getType();
            auto context = (v.declaredType != nullptr ? v.declaredType->context : v.context);

            if (type.isVoid())
                context.throwError (Errors::variableCannotBeVoid());

            throwErrorIfMultidimensionalArray (context, type);
        }